

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateAttachmentStates
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 SubpassIndex)

{
  Uint32 *Args_2;
  RENDER_DEVICE_TYPE RVar1;
  FramebufferVkImpl *pFVar2;
  ITextureView *pIVar3;
  int iVar4;
  RESOURCE_STATE RVar5;
  undefined4 extraout_var;
  ITexture *pSrcPtr;
  ulong uVar6;
  long lVar7;
  string msg;
  undefined4 in_stack_ffffffffffffff98;
  string local_60;
  DeviceContextBase<Diligent::EngineVkImplTraits> *local_40;
  RenderPassVkImpl *local_38;
  undefined4 extraout_var_00;
  
  if (this->m_RenderPassAttachmentsTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
    local_40 = this;
    if ((this->m_pActiveRenderPass).m_pObject == (RenderPassVkImpl *)0x0) {
      FormatString<char[31]>(&local_60,(char (*) [31])"There is no active render pass");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5ff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->m_pBoundFramebuffer).m_pObject == (FramebufferVkImpl *)0x0) {
      FormatString<char[31]>(&local_60,(char (*) [31])"There is no active framebuffer");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x600);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    pFVar2 = (this->m_pBoundFramebuffer).m_pObject;
    local_38 = (this->m_pActiveRenderPass).m_pObject;
    Args_2 = &(local_38->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.AttachmentCount;
    if ((pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
        .m_Desc.AttachmentCount !=
        (local_38->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount) {
      FormatString<char[31],unsigned_int,char[60],unsigned_int,char[2]>
                (&local_60,(Diligent *)"Framebuffer attachment count (",
                 (char (*) [31])
                 &(pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                  .m_Desc.AttachmentCount,
                 (uint *)") is not consistent with the render pass attachment count (",
                 (char (*) [60])Args_2,(uint *)0x930f15,
                 (char (*) [2])CONCAT44(SubpassIndex,in_stack_ffffffffffffff98));
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x605);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_38->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.SubpassCount < SubpassIndex) {
      FormatString<char[26],char[36]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SubpassIndex <= RPDesc.SubpassCount",(char (*) [36])local_38);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"UpdateAttachmentStates",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x606);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (*Args_2 != 0) {
      RVar1 = (((local_40->m_pDevice).m_pObject)->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Type;
      lVar7 = 0xc;
      uVar6 = 0;
      do {
        pIVar3 = (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                 .m_Desc.ppAttachments[uVar6];
        if (pIVar3 != (ITextureView *)0x0) {
          if (RVar1 == RENDER_DEVICE_TYPE_METAL) {
            iVar4 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar3);
            if (*(char *)(CONCAT44(extraout_var,iVar4) + 8) == '\x06') goto LAB_002b511f;
          }
          iVar4 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar3);
          pSrcPtr = (ITexture *)CONCAT44(extraout_var_00,iVar4);
          if (pSrcPtr != (ITexture *)0x0) {
            CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>(pSrcPtr);
          }
          if (*(int *)&pSrcPtr[0x12].super_IDeviceObject.super_IObject._vptr_IObject != 0) {
            if (SubpassIndex <
                (local_38->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.SubpassCount) {
              RVar5 = RenderPassBase<Diligent::EngineVkImplTraits>::GetAttachmentState
                                (&((local_40->m_pActiveRenderPass).m_pObject)->
                                  super_RenderPassBase<Diligent::EngineVkImplTraits>,SubpassIndex,
                                 (Uint32)uVar6);
            }
            else {
              RVar5 = *(RESOURCE_STATE *)
                       ((long)&((local_38->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                                .m_Desc.pAttachments)->Format + lVar7);
            }
            *(RESOURCE_STATE *)&pSrcPtr[0x12].super_IDeviceObject.super_IObject._vptr_IObject =
                 RVar5;
          }
        }
LAB_002b511f:
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 < *Args_2);
    }
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateAttachmentStates(Uint32 SubpassIndex)
{
    if (m_RenderPassAttachmentsTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
        return;

    DEV_CHECK_ERR(m_pActiveRenderPass != nullptr, "There is no active render pass");
    DEV_CHECK_ERR(m_pBoundFramebuffer != nullptr, "There is no active framebuffer");

    const RenderPassDesc&  RPDesc = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc = m_pBoundFramebuffer->GetDesc();
    VERIFY(FBDesc.AttachmentCount == RPDesc.AttachmentCount,
           "Framebuffer attachment count (", FBDesc.AttachmentCount, ") is not consistent with the render pass attachment count (", RPDesc.AttachmentCount, ")");
    VERIFY_EXPR(SubpassIndex <= RPDesc.SubpassCount);
    const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        if (ITextureView* pView = FBDesc.ppAttachments[i])
        {
            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex = ClassPtrCast<TextureImplType>(pView->GetTexture());
            if (pTex->IsInKnownState())
            {
                RESOURCE_STATE CurrState = SubpassIndex < RPDesc.SubpassCount ?
                    m_pActiveRenderPass->GetAttachmentState(SubpassIndex, i) :
                    RPDesc.pAttachments[i].FinalState;
                pTex->SetState(CurrState);
            }
        }
    }
}